

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O0

SRes crnlib::LzmaDecode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte *propData,
                       uint propSize,ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAlloc *alloc)

{
  ulong uVar1;
  SizeT dicLimit;
  SizeT outSize;
  SizeT inSize;
  undefined1 local_c8 [4];
  SRes res;
  CLzmaDec p;
  uint propSize_local;
  Byte *propData_local;
  SizeT *srcLen_local;
  Byte *src_local;
  SizeT *destLen_local;
  Byte *dest_local;
  
  uVar1 = *srcLen;
  dicLimit = *destLen;
  *destLen = 0;
  *srcLen = 0;
  if (uVar1 < 5) {
    dest_local._4_4_ = 6;
  }
  else {
    p.probs = (UInt16 *)0x0;
    p.prop.pb = 0;
    p.prop.dicSize = 0;
    p._132_4_ = propSize;
    dest_local._4_4_ = LzmaDec_AllocateProbs((CLzmaDec *)local_c8,propData,propSize,alloc);
    if (dest_local._4_4_ == 0) {
      p.probs = (UInt16 *)dest;
      p.dicPos = dicLimit;
      LzmaDec_Init((CLzmaDec *)local_c8);
      *srcLen = uVar1;
      inSize._4_4_ = LzmaDec_DecodeToDic((CLzmaDec *)local_c8,dicLimit,src,srcLen,finishMode,status)
      ;
      if ((inSize._4_4_ == 0) && (*status == LZMA_STATUS_NEEDS_MORE_INPUT)) {
        inSize._4_4_ = 6;
      }
      *destLen = p._40_8_;
      LzmaDec_FreeProbs((CLzmaDec *)local_c8,alloc);
      dest_local._4_4_ = inSize._4_4_;
    }
  }
  return dest_local._4_4_;
}

Assistant:

SRes LzmaDecode(Byte* dest, SizeT* destLen, const Byte* src, SizeT* srcLen,
                const Byte* propData, unsigned propSize, ELzmaFinishMode finishMode,
                ELzmaStatus* status, ISzAlloc* alloc) {
  CLzmaDec p;
  SRes res;
  SizeT inSize = *srcLen;
  SizeT outSize = *destLen;
  *srcLen = *destLen = 0;
  if (inSize < RC_INIT_SIZE)
    return SZ_ERROR_INPUT_EOF;

  LzmaDec_Construct(&p);
  res = LzmaDec_AllocateProbs(&p, propData, propSize, alloc);
  if (res != 0)
    return res;
  p.dic = dest;
  p.dicBufSize = outSize;

  LzmaDec_Init(&p);

  *srcLen = inSize;
  res = LzmaDec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);

  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;

  (*destLen) = p.dicPos;
  LzmaDec_FreeProbs(&p, alloc);
  return res;
}